

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall
ObjectTest_basic_has_Test::~ObjectTest_basic_has_Test(ObjectTest_basic_has_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_has) {
	object obj;

	EXPECT_FALSE(obj.has<bool>());
	EXPECT_FALSE(obj.has<signed char>());
	EXPECT_FALSE(obj.has<unsigned char>());
	EXPECT_FALSE(obj.has<short>());
	EXPECT_FALSE(obj.has<int>());
	EXPECT_FALSE(obj.has<long>());
	EXPECT_FALSE(obj.has<long long>());
	EXPECT_FALSE(obj.has<intmax_t>());
	EXPECT_FALSE(obj.has<float>());
	EXPECT_FALSE(obj.has<double>());
	EXPECT_FALSE(obj.has<long double>());
	EXPECT_FALSE(obj.has<std::u8string>());
	EXPECT_FALSE(obj.has<object::array_type>());
	EXPECT_FALSE(obj.has<object::map_type>());
}